

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void TPZFMatrix<std::complex<float>_>::MultAdd
               (complex<float> *ptr,int64_t rows,int64_t cols,TPZFMatrix<std::complex<float>_> *x,
               TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
               complex<float> alpha,complex<float> beta,int opt)

{
  _ComplexT _Var1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  char *msg1;
  int64_t c;
  long lVar6;
  complex<float> *pcVar7;
  complex<float> *pcVar8;
  complex<float> *pcVar9;
  ulong uVar10;
  long lVar11;
  complex<float> *pcVar12;
  float in_XMM0_Da;
  float fVar13;
  float in_XMM0_Db;
  float fVar15;
  undefined8 uVar14;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
  if ((int)alpha._M_value == 0) {
    if ((lVar2 != cols) ||
       ((bVar4 = in_XMM1_Da != 0.0 || in_XMM1_Db != 0.0, bVar4 &&
        ((msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>",
         (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != rows ||
         ((y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
          (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol))))))
    goto LAB_00be584f;
    uVar3 = rows;
    if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
       ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != rows)) {
      (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(z,rows);
    }
  }
  else {
    if (lVar2 != rows) {
LAB_00be584f:
      Error(msg1,(char *)0x0);
      return;
    }
    if ((((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) || (in_XMM1_Db != 0.0)) || (NAN(in_XMM1_Db))) {
      msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
      if (((y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != cols) ||
         (bVar4 = true,
         (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) goto LAB_00be584f;
    }
    else {
      bVar4 = false;
    }
    uVar3 = cols;
    if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
       ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != cols)) {
      (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(z,cols);
    }
  }
  if ((cols != 0 && rows != 0) &&
     (lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol, 0 < lVar2)) {
    uVar3 = uVar3 & 0xffffffff;
    lVar11 = 0;
    do {
      lVar6 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
      if ((lVar6 < 1) ||
         ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (bVar4) {
        if (z != y) {
          memcpy(z->fElem + lVar6 * lVar11,
                 y->fElem +
                 (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar11,
                 uVar3 * 8);
        }
        if (uVar3 != 0) {
          uVar10 = 0;
          do {
            lVar6 = 0;
            do {
              lVar5 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
              if ((lVar5 <= (long)uVar10) ||
                 ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar6)) {
                Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar5 = lVar5 * lVar6;
              pcVar8 = z->fElem;
              fVar19 = *(float *)&pcVar8[lVar5 + uVar10]._M_value;
              fVar16 = *(float *)((long)&pcVar8[lVar5 + uVar10]._M_value + 4);
              fVar13 = in_XMM1_Da * fVar19 - in_XMM1_Db * fVar16;
              fVar16 = in_XMM1_Da * fVar16 + in_XMM1_Db * fVar19;
              uVar14 = CONCAT44(fVar16,fVar13);
              if ((NAN(fVar13)) && (uVar14 = CONCAT44(fVar16,fVar13), NAN(fVar16))) {
                uVar14 = __mulsc3(fVar19);
              }
              *(int *)&pcVar8[lVar5 + uVar10]._M_value = (int)uVar14;
              *(int *)((long)&pcVar8[lVar5 + uVar10]._M_value + 4) = (int)((ulong)uVar14 >> 0x20);
              lVar6 = lVar6 + 1;
            } while (lVar2 != lVar6);
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar3);
        }
      }
      else if (uVar3 != 0) {
        memset(z->fElem + lVar6 * lVar11,0,uVar3 * 8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar2);
    if (0 < lVar2) {
      lVar11 = 0;
      do {
        if ((int)alpha._M_value == 0) {
          if (0 < cols) {
            lVar6 = 0;
            do {
              lVar5 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
              if ((lVar5 < 1) ||
                 ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
                Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (0 < rows) {
                pcVar9 = z->fElem + lVar5 * lVar11;
                lVar5 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
                pcVar7 = x->fElem;
                pcVar12 = pcVar9 + rows;
                pcVar8 = ptr + lVar6 * rows;
                do {
                  _Var1 = pcVar8->_M_value;
                  fVar13 = (float)(_Var1 >> 0x20);
                  fVar19 = (float)_Var1 * in_XMM0_Da - fVar13 * in_XMM0_Db;
                  fVar16 = in_XMM0_Da * fVar13 + in_XMM0_Db * (float)_Var1;
                  uVar14 = CONCAT44(fVar16,fVar19);
                  if ((NAN(fVar19)) && (uVar14 = CONCAT44(fVar16,fVar19), NAN(fVar16))) {
                    uVar14 = __mulsc3(in_XMM0_Da,in_XMM0_Db,_Var1,fVar13);
                  }
                  fVar19 = (float)((ulong)uVar14 >> 0x20);
                  _Var1 = pcVar7[lVar5 * lVar11 + lVar6]._M_value;
                  fVar16 = (float)_Var1;
                  fVar13 = (float)(_Var1 >> 0x20);
                  fVar17 = (float)uVar14 * fVar16 - fVar13 * fVar19;
                  fVar19 = fVar16 * fVar19 + (float)uVar14 * fVar13;
                  uVar14 = CONCAT44(fVar19,fVar17);
                  if ((NAN(fVar17)) && (uVar14 = CONCAT44(fVar19,fVar17), NAN(fVar19))) {
                    uVar14 = __mulsc3();
                  }
                  pcVar8 = pcVar8 + 1;
                  pcVar9->_M_value =
                       CONCAT44((float)(pcVar9->_M_value >> 0x20) + (float)((ulong)uVar14 >> 0x20),
                                (float)pcVar9->_M_value + (float)uVar14);
                  pcVar9 = pcVar9 + 1;
                } while (pcVar9 < pcVar12);
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != cols);
          }
        }
        else {
          lVar6 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
          if ((lVar6 < 1) ||
             ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (0 < cols) {
            pcVar7 = z->fElem + lVar6 * lVar11;
            lVar6 = 0;
            pcVar8 = ptr;
            do {
              if (rows < 1) {
                fVar19 = 0.0;
                fVar16 = 0.0;
              }
              else {
                pcVar12 = x->fElem +
                          (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                          lVar11;
                pcVar9 = pcVar12 + rows;
                fVar19 = 0.0;
                fVar16 = 0.0;
                do {
                  fVar17 = (float)pcVar8->_M_value;
                  fVar15 = (float)(pcVar8->_M_value >> 0x20);
                  fVar13 = *(float *)((long)&pcVar12->_M_value + 4);
                  fVar18 = *(float *)&pcVar12->_M_value * fVar17 - fVar15 * fVar13;
                  fVar13 = *(float *)&pcVar12->_M_value * fVar15 + fVar17 * fVar13;
                  uVar14 = CONCAT44(fVar13,fVar18);
                  if ((NAN(fVar18)) && (uVar14 = CONCAT44(fVar13,fVar18), NAN(fVar13))) {
                    uVar14 = __mulsc3(fVar17,fVar15);
                  }
                  fVar19 = fVar19 + (float)uVar14;
                  fVar16 = fVar16 + (float)((ulong)uVar14 >> 0x20);
                  pcVar8 = pcVar8 + 1;
                  pcVar12 = pcVar12 + 1;
                } while (pcVar12 < pcVar9);
              }
              fVar13 = fVar19 * in_XMM0_Da - fVar16 * in_XMM0_Db;
              fVar19 = fVar19 * in_XMM0_Db + fVar16 * in_XMM0_Da;
              uVar14 = CONCAT44(fVar19,fVar13);
              if ((NAN(fVar13)) && (uVar14 = CONCAT44(fVar19,fVar13), NAN(fVar19))) {
                uVar14 = __mulsc3(in_XMM0_Da,in_XMM0_Db);
              }
              pcVar7->_M_value =
                   CONCAT44((float)(pcVar7->_M_value >> 0x20) + (float)((ulong)uVar14 >> 0x20),
                            (float)pcVar7->_M_value + (float)uVar14);
              pcVar7 = pcVar7 + 1;
              lVar6 = lVar6 + 1;
            } while (lVar6 != cols);
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar2);
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TVar *ptr, int64_t rows, int64_t cols, const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta ,const int opt)
{
    
    
    if ((!opt && cols != x.Rows()) || (opt && rows != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && rows != y.Rows()) || (opt && cols != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != rows) {
            z.Redim(rows,x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != cols) {
            z.Redim(cols,x.Cols());
        }
    }
    unsigned numeq = opt ? cols : rows;
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if(!(rows*cols)) return;
    for (ic = 0; ic < xcols; ic++) {
        TVar *zp = &z(0,ic), *zlast = zp+numeq;
        if(beta != (TVar)0.) {
            const TVar *yp = &y.g(0,ic);
            if(&z != &y) {
                memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
            }
            for(int64_t i=0; i< numeq; i++) for(int64_t c=0; c<xcols; c++) z(i,c) *= beta;
        } else {
            while(zp != zlast) {
                *zp = 0.;
                zp ++;
            }
        }
    }
    
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                const TVar * fp = ptr +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            const TVar * fp = ptr;
            TVar *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
    
    
    
    
}